

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

errr finish_parse_projection(parser *p)

{
  projection *ppVar1;
  int iVar2;
  uint local_28;
  int local_24;
  wchar_t count;
  wchar_t element_count;
  projection *next;
  projection *projection;
  parser *p_local;
  
  local_24 = 0;
  z_info->projection_max = 0;
  for (next = (projection *)parser_priv(p); next != (projection *)0x0; next = next->next) {
    z_info->projection_max = z_info->projection_max + 1;
    if ((next->type != (char *)0x0) && (iVar2 = strcmp(next->type,"element"), iVar2 == 0)) {
      local_24 = local_24 + 1;
    }
  }
  if (local_24 + 1 < 0x1a) {
    quit_fmt("Too few elements in projection.txt!");
  }
  else if (0x1a < local_24 + 1) {
    quit_fmt("Too many elements in projection.txt!");
  }
  projections = (projection_conflict *)mem_zalloc((ulong)z_info->projection_max * 0x68);
  local_28 = (uint)z_info->projection_max;
  next = (projection *)parser_priv(p);
  while (local_28 = local_28 - 1, next != (projection *)0x0) {
    memcpy(projections + (int)local_28,next,0x68);
    ppVar1 = next->next;
    mem_free(next);
    next = ppVar1;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_projection(struct parser *p) {
	struct projection *projection, *next = NULL;
	int element_count = 0, count = 0;

	/* Count the entries */
	z_info->projection_max = 0;
	projection = parser_priv(p);
	while (projection) {
		z_info->projection_max++;
		if (projection->type && streq(projection->type, "element")) {
			element_count++;
		}
		projection = projection->next;
	}

	if (element_count + 1 < (int) N_ELEMENTS(element_names)) {
		quit_fmt("Too few elements in projection.txt!");
	} else if (element_count + 1 > (int) N_ELEMENTS(element_names)) {
		quit_fmt("Too many elements in projection.txt!");
	}

	/* Allocate the direct access list and copy the data to it */
	projections = mem_zalloc((z_info->projection_max) * sizeof(*projection));
	count = z_info->projection_max - 1;
	for (projection = parser_priv(p); projection; projection = next, count--) {
		memcpy(&projections[count], projection, sizeof(*projection));
		next = projection->next;
		mem_free(projection);
	}

	parser_destroy(p);
	return 0;
}